

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O1

int Fxch_DivRemoveLits(Vec_Int_t *vCube0,Vec_Int_t *vCube1,Vec_Int_t *vDiv,int *fCompl)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  
  iVar7 = 0;
  iVar6 = 0;
  iVar3 = 0;
  if (0 < vDiv->nSize) {
    piVar1 = vDiv->pArray;
    lVar9 = 0;
    iVar3 = 0;
    iVar6 = 0;
    do {
      uVar11 = piVar1[lVar9];
      if ((int)uVar11 < 0) goto LAB_004bf1a2;
      uVar10 = uVar11 >> 1;
      if ((uVar11 & 2) == 0) {
        iVar13 = vCube0->nSize;
        uVar14 = (ulong)iVar13;
        iVar5 = 0;
        if (1 < (long)uVar14) {
          piVar8 = vCube0->pArray;
          if (piVar8[1] == uVar10) {
            bVar17 = true;
            uVar12 = 1;
            uVar16 = 2;
          }
          else {
            uVar16 = 2;
            do {
              uVar12 = uVar16;
              if (uVar14 == uVar12) goto LAB_004bed26;
              uVar16 = uVar12 + 1;
            } while (piVar8[uVar12] != uVar10);
            bVar17 = uVar12 < uVar14;
          }
          if (bVar17) {
            if ((int)uVar12 + 1 < iVar13) {
              piVar4 = piVar8 + uVar12;
              do {
                *piVar4 = piVar8[uVar16];
                uVar16 = uVar16 + 1;
                iVar13 = vCube0->nSize;
                piVar4 = piVar4 + 1;
              } while ((int)uVar16 < iVar13);
            }
            vCube0->nSize = iVar13 + -1;
            iVar5 = 1;
          }
        }
LAB_004bed26:
        iVar3 = iVar3 + iVar5;
      }
      else {
        iVar13 = vCube0->nSize;
        uVar14 = (ulong)iVar13;
        iVar5 = 0;
        if (1 < (long)uVar14) {
          piVar8 = vCube0->pArray;
          if (piVar8[1] == uVar10) {
            bVar17 = true;
            uVar12 = 1;
            uVar16 = 2;
          }
          else {
            uVar16 = 2;
            do {
              uVar12 = uVar16;
              if (uVar14 == uVar12) goto LAB_004bed84;
              uVar16 = uVar12 + 1;
            } while (piVar8[uVar12] != uVar10);
            bVar17 = uVar12 < uVar14;
          }
          if (bVar17) {
            if ((int)uVar12 + 1 < iVar13) {
              piVar4 = piVar8 + uVar12;
              do {
                *piVar4 = piVar8[uVar16];
                uVar16 = uVar16 + 1;
                iVar13 = vCube0->nSize;
                piVar4 = piVar4 + 1;
              } while ((int)uVar16 < iVar13);
            }
            vCube0->nSize = iVar13 + -1;
            iVar5 = 1;
          }
        }
LAB_004bed84:
        iVar6 = iVar6 + iVar5;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vDiv->nSize);
  }
  if (vDiv->nSize < 1) {
    bVar17 = false;
  }
  else {
    piVar1 = vDiv->pArray;
    lVar9 = 0;
    iVar7 = 0;
    do {
      if (piVar1[lVar9] < 0) goto LAB_004bf1a2;
      iVar13 = vCube1->nSize;
      uVar14 = (ulong)iVar13;
      iVar5 = 0;
      if (1 < (long)uVar14) {
        uVar11 = (uint)piVar1[lVar9] >> 1;
        piVar8 = vCube1->pArray;
        iVar5 = 0;
        if (piVar8[1] == uVar11) {
          bVar17 = true;
          uVar12 = 1;
          uVar16 = 2;
        }
        else {
          uVar16 = 2;
          do {
            uVar12 = uVar16;
            if (uVar14 == uVar12) goto LAB_004bee38;
            uVar16 = uVar12 + 1;
          } while (piVar8[uVar12] != uVar11);
          bVar17 = uVar12 < uVar14;
        }
        if (bVar17) {
          if ((int)uVar12 + 1 < iVar13) {
            piVar4 = piVar8 + uVar12;
            do {
              *piVar4 = piVar8[uVar16];
              uVar16 = uVar16 + 1;
              iVar13 = vCube1->nSize;
              piVar4 = piVar4 + 1;
            } while ((int)uVar16 < iVar13);
          }
          vCube1->nSize = iVar13 + -1;
          iVar5 = 1;
        }
      }
LAB_004bee38:
      iVar7 = iVar7 + iVar5;
      lVar9 = lVar9 + 1;
    } while (lVar9 < vDiv->nSize);
    bVar17 = vDiv->nSize == 2;
  }
  if ((bVar17) && (0 < vDiv->nSize)) {
    piVar1 = vDiv->pArray;
    lVar9 = 0;
    do {
      if (piVar1[lVar9] < 0) goto LAB_004bf1a2;
      uVar11 = (uint)piVar1[lVar9] >> 1 ^ 1;
      iVar13 = vCube0->nSize;
      uVar14 = (ulong)iVar13;
      if (1 < (long)uVar14) {
        piVar8 = vCube0->pArray;
        if (piVar8[1] == uVar11) {
          bVar17 = true;
          uVar12 = 1;
          uVar16 = 2;
        }
        else {
          uVar16 = 2;
          do {
            uVar12 = uVar16;
            if (uVar14 == uVar12) goto LAB_004beefc;
            uVar16 = uVar12 + 1;
          } while (piVar8[uVar12] != uVar11);
          bVar17 = uVar12 < uVar14;
        }
        if (bVar17) {
          if ((int)uVar12 + 1 < iVar13) {
            piVar4 = piVar8 + uVar12;
            do {
              *piVar4 = piVar8[uVar16];
              uVar16 = uVar16 + 1;
              iVar13 = vCube0->nSize;
              piVar4 = piVar4 + 1;
            } while ((int)uVar16 < iVar13);
          }
          vCube0->nSize = iVar13 + -1;
        }
      }
LAB_004beefc:
      iVar13 = vCube1->nSize;
      uVar14 = (ulong)iVar13;
      if (1 < (long)uVar14) {
        piVar8 = vCube1->pArray;
        if (piVar8[1] == uVar11) {
          bVar17 = true;
          uVar12 = 1;
          uVar16 = 2;
        }
        else {
          uVar16 = 2;
          do {
            uVar12 = uVar16;
            if (uVar14 == uVar12) goto LAB_004bef72;
            uVar16 = uVar12 + 1;
          } while (piVar8[uVar12] != uVar11);
          bVar17 = uVar12 < uVar14;
        }
        if (bVar17) {
          if ((int)uVar12 + 1 < iVar13) {
            piVar4 = piVar8 + uVar12;
            do {
              *piVar4 = piVar8[uVar16];
              uVar16 = uVar16 + 1;
              iVar13 = vCube1->nSize;
              piVar4 = piVar4 + 1;
            } while ((int)uVar16 < iVar13);
          }
          vCube1->nSize = iVar13 + -1;
        }
      }
LAB_004bef72:
      lVar9 = lVar9 + 1;
    } while (lVar9 < vDiv->nSize);
  }
  iVar7 = iVar3 + iVar6 + iVar7;
  if (vDiv->nSize == 4) {
    puVar2 = (uint *)vDiv->pArray;
    if (((((int)*puVar2 < 0) || ((int)puVar2[1] < 0)) || ((int)puVar2[2] < 0)) ||
       ((int)puVar2[3] < 0)) {
LAB_004bf1a2:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar11 = (puVar2[1] ^ *puVar2) & 0x7ffffffe;
    if ((uVar11 == 2) && (iVar6 == 1 && ((puVar2[3] ^ puVar2[2]) & 0x7ffffffe) == 2)) {
      *fCompl = 1;
    }
    if ((uVar11 == 2) && (iVar7 == 2)) {
      *fCompl = 1;
      if (vDiv->nSize < 1) {
        iVar7 = 2;
      }
      else {
        iVar7 = 2;
        uVar14 = 0;
        do {
          if ((int)puVar2[uVar14] < 0) goto LAB_004bf1a2;
          iVar3 = vCube0->nSize;
          uVar16 = (ulong)iVar3;
          iVar6 = 0;
          if (1 < (long)uVar16) {
            uVar11 = (uint)(1 < uVar14) ^ puVar2[uVar14] >> 1;
            piVar1 = vCube0->pArray;
            if (piVar1[1] == uVar11) {
              bVar17 = true;
              uVar15 = 1;
              uVar12 = 2;
            }
            else {
              uVar12 = 2;
              do {
                uVar15 = uVar12;
                iVar6 = 0;
                if (uVar16 == uVar15) goto LAB_004bf0bd;
                uVar12 = uVar15 + 1;
              } while (piVar1[uVar15] != uVar11);
              bVar17 = uVar15 < uVar16;
            }
            iVar6 = 0;
            if (bVar17) {
              if ((int)uVar15 + 1 < iVar3) {
                piVar8 = piVar1 + uVar15;
                do {
                  *piVar8 = piVar1[uVar12];
                  uVar12 = uVar12 + 1;
                  iVar3 = vCube0->nSize;
                  piVar8 = piVar8 + 1;
                } while ((int)uVar12 < iVar3);
              }
              vCube0->nSize = iVar3 + -1;
              iVar6 = 1;
            }
          }
LAB_004bf0bd:
          iVar7 = iVar7 + iVar6;
          uVar14 = uVar14 + 1;
        } while ((long)uVar14 < (long)vDiv->nSize);
      }
      if (0 < vDiv->nSize) {
        uVar14 = 0;
        do {
          if ((int)puVar2[uVar14] < 0) goto LAB_004bf1a2;
          iVar3 = vCube1->nSize;
          uVar16 = (ulong)iVar3;
          iVar6 = 0;
          if (1 < (long)uVar16) {
            uVar11 = (uint)(1 < uVar14) ^ puVar2[uVar14] >> 1;
            piVar1 = vCube1->pArray;
            iVar6 = 0;
            if (piVar1[1] == uVar11) {
              bVar17 = true;
              uVar15 = 1;
              uVar12 = 2;
            }
            else {
              uVar12 = 2;
              do {
                uVar15 = uVar12;
                if (uVar16 == uVar15) goto LAB_004bf180;
                uVar12 = uVar15 + 1;
              } while (piVar1[uVar15] != uVar11);
              bVar17 = uVar15 < uVar16;
            }
            if (bVar17) {
              if ((int)uVar15 + 1 < iVar3) {
                piVar8 = piVar1 + uVar15;
                do {
                  *piVar8 = piVar1[uVar12];
                  uVar12 = uVar12 + 1;
                  iVar3 = vCube1->nSize;
                  piVar8 = piVar8 + 1;
                } while ((int)uVar12 < iVar3);
              }
              vCube1->nSize = iVar3 + -1;
              iVar6 = 1;
            }
          }
LAB_004bf180:
          iVar7 = iVar7 + iVar6;
          uVar14 = uVar14 + 1;
        } while ((long)uVar14 < (long)vDiv->nSize);
      }
    }
  }
  return iVar7;
}

Assistant:

int Fxch_DivRemoveLits( Vec_Int_t* vCube0,
                        Vec_Int_t* vCube1,
                        Vec_Int_t* vDiv,
                        int *fCompl )
{
    int i,
        Lit,
        CountP = 0,
        CountN = 0,
        Count = 0,
        ret = 0;

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( Abc_LitIsCompl( Abc_Lit2Var( Lit ) ) )
            CountN += Vec_IntRemove1( vCube0, Abc_Lit2Var( Lit ) );
        else
            CountP += Vec_IntRemove1( vCube0, Abc_Lit2Var( Lit ) );

    Vec_IntForEachEntry( vDiv, Lit, i )
        Count += Vec_IntRemove1( vCube1, Abc_Lit2Var( Lit ) );

   if ( Vec_IntSize( vDiv ) == 2 )
       Vec_IntForEachEntry( vDiv, Lit, i )
       {
           Vec_IntRemove1( vCube0, Abc_LitNot( Abc_Lit2Var( Lit ) ) );
           Vec_IntRemove1( vCube1, Abc_LitNot( Abc_Lit2Var( Lit ) ) );
       }

    ret = Count + CountP + CountN;

    if ( Vec_IntSize( vDiv ) == 4 )
    {
        int Lit0 = Abc_Lit2Var( Vec_IntEntry( vDiv, 0 ) ),
            Lit1 = Abc_Lit2Var( Vec_IntEntry( vDiv, 1 ) ),
            Lit2 = Abc_Lit2Var( Vec_IntEntry( vDiv, 2 ) ),
            Lit3 = Abc_Lit2Var( Vec_IntEntry( vDiv, 3 ) );

        if ( Lit0 == Abc_LitNot( Lit1 ) && Lit2 == Abc_LitNot( Lit3 ) && CountN == 1 )
            *fCompl = 1;

        if ( Lit0 == Abc_LitNot( Lit1 ) && ret == 2 )
        {
            *fCompl = 1;

            Vec_IntForEachEntry( vDiv, Lit, i )
                ret += Vec_IntRemove1( vCube0, ( Abc_Lit2Var( Lit ) ^ (fCompl && i > 1) ) );

            Vec_IntForEachEntry( vDiv, Lit, i )
                ret += Vec_IntRemove1( vCube1, ( Abc_Lit2Var( Lit ) ^ (fCompl && i > 1) ) );
        }
    }

    return ret;
}